

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata_op.cc
# Opt level: O1

PcodeOp * __thiscall
Funcdata::newIndirectOp(Funcdata *this,PcodeOp *indeffect,Address *addr,int4 size,uint4 extraFlags)

{
  Varnode *pVVar1;
  PcodeOp *op;
  
  pVVar1 = newVarnode(this,size,addr,(Datatype *)0x0);
  op = PcodeOpBank::create(&this->obank,2,&(indeffect->start).pc);
  op->flags = op->flags | extraFlags;
  newVarnodeOut(this,size,addr,op);
  PcodeOpBank::changeOpcode
            (&this->obank,op,
             (this->glb->inst).super__Vector_base<TypeOp_*,_std::allocator<TypeOp_*>_>._M_impl.
             super__Vector_impl_data._M_start[0x3d]);
  opSetInput(this,op,pVVar1,0);
  pVVar1 = newVarnodeIop(this,indeffect);
  opSetInput(this,op,pVVar1,1);
  opInsertBefore(this,op,indeffect);
  return op;
}

Assistant:

PcodeOp *Funcdata::newIndirectOp(PcodeOp *indeffect,const Address &addr,int4 size,uint4 extraFlags)

{
  Varnode *newin;
  PcodeOp *newop;

  newin = newVarnode(size,addr);
  newop = newOp(2,indeffect->getAddr());
  newop->flags |= extraFlags;
  newVarnodeOut(size,addr,newop);
  opSetOpcode(newop,CPUI_INDIRECT);
  opSetInput(newop,newin,0);
  opSetInput(newop,newVarnodeIop(indeffect),1);
  opInsertBefore(newop,indeffect);
  return newop;
}